

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-mpq.c
# Opt level: O0

int mpq_cmp(__mpq_struct *a,__mpq_struct *b)

{
  int iVar1;
  __mpz_struct *unaff_retaddr;
  __mpz_struct *in_stack_00000008;
  int res;
  mpz_t t2;
  mpz_t t1;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __mpz_struct *in_stack_ffffffffffffffc8;
  __mpz_struct local_28 [2];
  
  mpz_init(local_28);
  mpz_init((__mpz_struct *)&stack0xffffffffffffffc8);
  mpz_mul((__mpz_struct *)t2[0]._0_8_,in_stack_00000008,unaff_retaddr);
  mpz_mul((__mpz_struct *)t2[0]._0_8_,in_stack_00000008,unaff_retaddr);
  iVar1 = mpz_cmp(in_stack_ffffffffffffffc8,
                  (__mpz_struct *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  mpz_clear((__mpz_struct *)0x9aee2f);
  mpz_clear((__mpz_struct *)0x9aee39);
  return iVar1;
}

Assistant:

int
mpq_cmp (const mpq_t a, const mpq_t b)
{
  mpz_t t1, t2;
  int res;

  mpz_init (t1);
  mpz_init (t2);
  mpz_mul (t1, mpq_numref (a), mpq_denref (b));
  mpz_mul (t2, mpq_numref (b), mpq_denref (a));
  res = mpz_cmp (t1, t2);
  mpz_clear (t1);
  mpz_clear (t2);

  return res;
}